

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

string * __thiscall
soul::Value::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,StringDictionary *dictionary)

{
  DefaultPrinter p;
  ValuePrinter local_1b0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1b0.dictionary = (StringDictionary *)0x0;
  local_1b0._vptr_ValuePrinter = (_func_int **)&PTR__DefaultPrinter_002ca3b8;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1b0.dictionary = dictionary;
  print(this,&local_1b0);
  std::__cxx11::stringbuf::str();
  local_1b0._vptr_ValuePrinter = (_func_int **)&PTR__DefaultPrinter_002ca3b8;
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::getDescription (const StringDictionary* dictionary) const
{
    struct DefaultPrinter  : public ValuePrinter
    {
        void print (std::string_view s) override  { out << s; }
        std::ostringstream out;
    };

    DefaultPrinter p;
    p.dictionary = dictionary;
    print (p);
    return p.out.str();
}